

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
vk::BinaryRegistryDetail::anon_unknown_8::getSearchPath
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ProgramIdentifier *id)

{
  size_type __n;
  reference dst;
  void *src;
  allocator<unsigned_int> local_81;
  value_type_conflict1 local_80;
  undefined1 local_79;
  size_type local_78;
  size_t numWords;
  size_t strLen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string combinedStr;
  ProgramIdentifier *id_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words;
  
  combinedStr.field_2._8_8_ = id;
  std::operator+(&local_58,&id->testCasePath,'#');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (combinedStr.field_2._8_8_ + 0x20));
  std::__cxx11::string::~string((string *)&local_58);
  numWords = std::__cxx11::string::size();
  __n = (numWords >> 2) + 1;
  local_79 = 0;
  local_80 = 0;
  local_78 = __n;
  std::allocator<unsigned_int>::allocator(&local_81);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_80,&local_81);
  std::allocator<unsigned_int>::~allocator(&local_81);
  dst = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (__return_storage_ptr__,0);
  src = (void *)std::__cxx11::string::c_str();
  ::deMemcpy(dst,src,numWords);
  local_79 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<deUint32> getSearchPath (const ProgramIdentifier& id)
{
	const std::string	combinedStr		= id.testCasePath + '#' + id.programName;
	const size_t		strLen			= combinedStr.size();
	const size_t		numWords		= strLen/4 + 1;		// Must always end up with at least one 0 byte
	vector<deUint32>	words			(numWords, 0u);

	deMemcpy(&words[0], combinedStr.c_str(), strLen);

	return words;
}